

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

double orient2dexact(double *pa,double *pb,double *pc)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double _0;
  double _j;
  double _i;
  double err3;
  double err2;
  double err1;
  double blo;
  double bhi;
  double alo;
  double ahi;
  double abig;
  double c;
  double around;
  double bround;
  double avirt;
  double bvirt;
  int wlength;
  int vlength;
  double w [12];
  double v [8];
  double cterms3;
  double bterms3;
  double aterms3;
  double cterms [4];
  double bterms [4];
  double aterms [4];
  double cxby0;
  double cxay0;
  double bxay0;
  double bxcy0;
  double axcy0;
  double axby0;
  double cxby1;
  double cxay1;
  double bxay1;
  double bxcy1;
  double axcy1;
  double axby1;
  double *pc_local;
  double *pb_local;
  double *pa_local;
  
  dVar2 = splitter * *pa - (splitter * *pa - *pa);
  dVar3 = splitter * pb[1] - (splitter * pb[1] - pb[1]);
  dVar2 = (*pa - dVar2) * (pb[1] - dVar3) +
          -(-dVar2 * (pb[1] - dVar3) + -(*pa - dVar2) * dVar3 + -dVar2 * dVar3 + *pa * pb[1]);
  dVar3 = splitter * *pa - (splitter * *pa - *pa);
  dVar4 = splitter * pc[1] - (splitter * pc[1] - pc[1]);
  dVar3 = (*pa - dVar3) * (pc[1] - dVar4) +
          -(-dVar3 * (pc[1] - dVar4) + -(*pa - dVar3) * dVar4 + -dVar3 * dVar4 + *pa * pc[1]);
  dVar4 = dVar2 - dVar3;
  dVar5 = dVar2 - dVar4;
  bterms[3] = (dVar2 - (dVar4 + dVar5)) + (dVar5 - dVar3);
  dVar2 = *pb * pc[1];
  dVar3 = splitter * *pb - (splitter * *pb - *pb);
  dVar4 = splitter * pc[1] - (splitter * pc[1] - pc[1]);
  dVar3 = (*pb - dVar3) * (pc[1] - dVar4) +
          -(-dVar3 * (pc[1] - dVar4) + -(*pb - dVar3) * dVar4 + -dVar3 * dVar4 + dVar2);
  dVar4 = *pb * pa[1];
  dVar5 = splitter * *pb - (splitter * *pb - *pb);
  dVar6 = splitter * pa[1] - (splitter * pa[1] - pa[1]);
  dVar5 = (*pb - dVar5) * (pa[1] - dVar6) +
          -(-dVar5 * (pa[1] - dVar6) + -(*pb - dVar5) * dVar6 + -dVar5 * dVar6 + dVar4);
  dVar6 = dVar3 - dVar5;
  cterms[3] = (dVar3 - (dVar6 + (dVar3 - dVar6))) + ((dVar3 - dVar6) - dVar5);
  dVar3 = dVar2 + dVar6;
  dVar2 = (dVar2 - (dVar3 - (dVar3 - dVar2))) + (dVar6 - (dVar3 - dVar2));
  dVar5 = dVar2 - dVar4;
  bterms[0] = (dVar2 - (dVar5 + (dVar2 - dVar5))) + ((dVar2 - dVar5) - dVar4);
  bterms[2] = dVar3 + dVar5;
  bterms[1] = (dVar3 - (bterms[2] - (bterms[2] - dVar3))) + (dVar5 - (bterms[2] - dVar3));
  dVar2 = *pc * pa[1];
  dVar3 = splitter * *pc - (splitter * *pc - *pc);
  dVar4 = splitter * pa[1] - (splitter * pa[1] - pa[1]);
  dVar3 = (*pc - dVar3) * (pa[1] - dVar4) +
          -(-dVar3 * (pa[1] - dVar4) + -(*pc - dVar3) * dVar4 + -dVar3 * dVar4 + dVar2);
  dVar4 = *pc * pb[1];
  dVar5 = splitter * *pc - (splitter * *pc - *pc);
  dVar6 = splitter * pb[1] - (splitter * pb[1] - pb[1]);
  dVar5 = (*pc - dVar5) * (pb[1] - dVar6) +
          -(-dVar5 * (pb[1] - dVar6) + -(*pc - dVar5) * dVar6 + -dVar5 * dVar6 + dVar4);
  dVar6 = dVar3 - dVar5;
  aterms3 = (dVar3 - (dVar6 + (dVar3 - dVar6))) + ((dVar3 - dVar6) - dVar5);
  dVar3 = dVar2 + dVar6;
  dVar2 = (dVar2 - (dVar3 - (dVar3 - dVar2))) + (dVar6 - (dVar3 - dVar2));
  dVar5 = dVar2 - dVar4;
  cterms[0] = (dVar2 - (dVar5 + (dVar2 - dVar5))) + ((dVar2 - dVar5) - dVar4);
  cterms[2] = dVar3 + dVar5;
  cterms[1] = (dVar3 - (cterms[2] - (cterms[2] - dVar3))) + (dVar5 - (cterms[2] - dVar3));
  iVar1 = fast_expansion_sum_zeroelim(4,bterms + 3,4,cterms + 3,w + 0xb);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,w + 0xb,4,&aterms3,(double *)&wlength);
  return *(double *)(&wlength + (long)(iVar1 + -1) * 2);
}

Assistant:

REAL orient2dexact(REAL *pa, REAL *pb, REAL *pc)
{
  INEXACT REAL axby1, axcy1, bxcy1, bxay1, cxay1, cxby1;
  REAL axby0, axcy0, bxcy0, bxay0, cxay0, cxby0;
  REAL aterms[4], bterms[4], cterms[4];
  INEXACT REAL aterms3, bterms3, cterms3;
  REAL v[8], w[12];
  int vlength, wlength;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;

  Two_Product(pa[0], pb[1], axby1, axby0);
  Two_Product(pa[0], pc[1], axcy1, axcy0);
  Two_Two_Diff(axby1, axby0, axcy1, axcy0,
               aterms3, aterms[2], aterms[1], aterms[0]);
  aterms[3] = aterms3;

  Two_Product(pb[0], pc[1], bxcy1, bxcy0);
  Two_Product(pb[0], pa[1], bxay1, bxay0);
  Two_Two_Diff(bxcy1, bxcy0, bxay1, bxay0,
               bterms3, bterms[2], bterms[1], bterms[0]);
  bterms[3] = bterms3;

  Two_Product(pc[0], pa[1], cxay1, cxay0);
  Two_Product(pc[0], pb[1], cxby1, cxby0);
  Two_Two_Diff(cxay1, cxay0, cxby1, cxby0,
               cterms3, cterms[2], cterms[1], cterms[0]);
  cterms[3] = cterms3;

  vlength = fast_expansion_sum_zeroelim(4, aterms, 4, bterms, v);
  wlength = fast_expansion_sum_zeroelim(vlength, v, 4, cterms, w);

  return w[wlength - 1];
}